

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

double __thiscall
ON_SubDVertex::GetSharpSubdivisionPoint(ON_SubDVertex *this,uint *count,ON_SubDVertex **v,double *c)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDVertex *pOVar3;
  uint uVar4;
  ulong uVar5;
  ON_SubDEdge *this_00;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  ON_SubDVertex *other_v [2];
  uint local_64;
  ON_SubDVertex *local_58 [2];
  double *local_48;
  ON_SubDVertex **local_40;
  uint *local_38;
  
  *count = 0;
  v[2] = (ON_SubDVertex *)0x0;
  *v = (ON_SubDVertex *)0x0;
  v[1] = (ON_SubDVertex *)0x0;
  c[2] = 0.0;
  *c = 0.0;
  c[1] = 0.0;
  if (((this->m_vertex_tag < 5) && ((0x16U >> (this->m_vertex_tag & 0x1f) & 1) != 0)) &&
     (pOVar2 = this->m_edges, pOVar2 != (ON_SubDEdgePtr *)0x0)) {
    local_58[0] = (ON_SubDVertex *)0x0;
    local_58[1] = (ON_SubDVertex *)0x0;
    uVar1 = this->m_edge_count;
    if ((ulong)uVar1 == 0) {
      bVar7 = false;
      dVar8 = 0.0;
      local_64 = 0;
    }
    else {
      uVar6 = 0;
      local_64 = 0;
      uVar5 = 0;
      dVar8 = 0.0;
      local_48 = c;
      local_40 = v;
      local_38 = count;
      do {
        this_00 = (ON_SubDEdge *)(pOVar2[uVar6].m_ptr & 0xfffffffffffffff8);
        if (this_00 != (ON_SubDEdge *)0x0) {
          uVar4 = (uint)uVar5;
          if (this_00->m_edge_tag == Crease) {
            if (uVar4 < 2) {
              pOVar3 = this_00->m_vertex[1];
              if (this_00->m_vertex[0] == this) {
                if (pOVar3 == this) goto LAB_005d4dd2;
              }
              else {
                bVar7 = pOVar3 != this;
                pOVar3 = this_00->m_vertex[0];
                if (bVar7) {
LAB_005d4dd2:
                  pOVar3 = (ON_SubDVertex *)0x0;
                }
              }
              local_58[uVar5] = pOVar3;
            }
            uVar5 = (ulong)(uVar4 + 1);
          }
          else {
            bVar7 = ON_SubDEdge::IsSharp(this_00);
            if ((bVar7) && (dVar9 = ON_SubDEdge::EndSharpness(this_00,this), 0.0 < dVar9)) {
              if (uVar4 < 2) {
                pOVar3 = this_00->m_vertex[1];
                if (this_00->m_vertex[0] == this) {
                  if (pOVar3 == this) goto LAB_005d4e26;
                }
                else {
                  bVar7 = pOVar3 != this;
                  pOVar3 = this_00->m_vertex[0];
                  if (bVar7) {
LAB_005d4e26:
                    pOVar3 = (ON_SubDVertex *)0x0;
                  }
                }
                local_58[uVar5] = pOVar3;
              }
              uVar5 = (ulong)(uVar4 + 1);
              if (dVar9 <= dVar8) {
                dVar9 = dVar8;
              }
              local_64 = local_64 + 1;
              dVar8 = dVar9;
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      bVar7 = (int)uVar5 == 2;
      c = local_48;
      v = local_40;
      count = local_38;
    }
    dVar8 = Internal_VertexSharpnessCalculationHelper(this,local_64,dVar8);
    if (0.0 < dVar8) {
      if ((bool)(local_58[1] != (ON_SubDVertex *)0x0 &
                local_58[0] != (ON_SubDVertex *)0x0 & local_64 != 0 & bVar7)) {
        *c = 0.75;
        c[1] = 0.125;
        c[2] = 0.125;
        *v = this;
        v[1] = local_58[0];
        v[2] = local_58[1];
        uVar4 = 3;
      }
      else {
        *c = 1.0;
        *v = this;
        uVar4 = 1;
      }
      *count = uVar4;
      if (0.0 < dVar8) {
        return dVar8;
      }
    }
  }
  return 0.0;
}

Assistant:

double ON_SubDVertex::GetSharpSubdivisionPoint(
  unsigned& count,
  const ON_SubDVertex* v[3],
  double c[3]
) const
{
  // Below "sharp edge" means an edge attached to this vertex that has a smooth tag
  // and a nonzero sharpness at the end attached to this vertex.
  // This definition of vertex sharpness is from DeRose, Kass, Truong 1998.
  // - If the vertex is smooth and adjacent to zero or one sharp edges, 
  //   then the ordinary vertex subdivision rule is used,
  //   sharp_subdivision_point is set to NanPoint,
  //   and 0.0 is returned.
  // - If the vertex is adjacent to 3 or more sharp edges and crease edges, 
  //   then the corner vertex subdivision rule is used,
  //   sharp_subdivision_point = vertex control net point,
  //   and the maximum edge sharpness at the vertex is returned.
  // - If the vertex is adjacent to 2 sharp edges and crease edges, 
  //   then sharp_subdivision_point = crease vertex subdivision point, 
  //   and the average of the edge sharpnesses is returned.
  // 
  // The returned vertex sharpens is always >= 0.
  // When the returned vertex sharpness is > 0, the vertex subdivision point
  // (1-s)*(ordinary subdivision point) + s*sharp_subdivision_point,
  // where s = min(returned vertex sharpness, 1).
  //

  // NOTE WELL:
  // The double returned by ON_SubDVertex::VertexSharpness() must
  // always be identical to the double returned by this function.
  //
  //  ALWAYS CHANGE THE CODE IN ON_SubDVertex::GetSharpSubdivisionPoint() first
  //  and then update ON_SubDVertex::VertexSharpness() as needed.

  count = 0;
  v[0] = v[1] = v[2] = nullptr;
  c[0] = c[1] = c[2] = 0.0;
  if (this->IsSmoothOrDartOrCrease() && nullptr != m_edges)
  {
    unsigned int sharp_edge_count = 0;
    unsigned other_v_count = 0;
    double max_end_sharpeness = 0.0;
    const ON_SubDVertex* other_v[2] = {};

    // NOTE WELL:
    // In low level evaluation code, the edges are only those in the sector
    // being evaluated. See RH-76871 for an example
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e)
        continue;
      if (e->IsCrease())
      {
        if (other_v_count < 2)
          other_v[other_v_count] = e->OtherEndVertex(this);
        ++other_v_count;
      }
      else if ( e->IsSharp() )
      {
        // The edge is has a smooth tag and at leas one end has sharpness > 0.
        // For variable edge sharpness, s can be zero at an end.
        const double s = e->EndSharpness(this);
        if (s > 0.0)
        {
          if (other_v_count < 2)
            other_v[other_v_count] = e->OtherEndVertex(this);
          ++other_v_count;
          if (s > max_end_sharpeness)
            max_end_sharpeness = s;
          ++sharp_edge_count;
        }
      }
    }

    const double vertex_sharpness = Internal_VertexSharpnessCalculationHelper(
      this,
      sharp_edge_count,
      max_end_sharpeness
    );


    if (vertex_sharpness > 0.0)
    {      
      if (sharp_edge_count > 0 && 2 == other_v_count && nullptr != other_v[0] && nullptr != other_v[1])
      {
        // 2 creases and sharps - "crease" subdivision point
        c[0] = 0.75; 
        c[1] = 0.125;
        c[2] = 0.125;
        v[0] = this;
        v[1] = other_v[0];
        v[2] = other_v[1];
        count = 3;
      }
      else
      {
        // Use "corner" subdivision point as the sharp contribution.
        // There are two possibilities:
        // 
        // A) (sharp_edge_count > 0 and other_v_count >= 3)
        // At least one sharp edge and a total of 3 or more creases and sharps.
        // 
        // B) (sharp_edge_count = 0, other_v_count = 2, tag = ON_SubDVertexTag::Crease)
        // Two creases an no sharps at an interior crease vertex has sharp edges in one
        // sector and no sharp edges in the other sector and this vertex
        // is the sector center in low level evaluation code that stores only the
        // sector components. See RH-76871 for an example.
        c[0] = 1.0;
        v[0] = this;
        count = 1;
      }
      return vertex_sharpness;
    }
  }
  return 0.0;
}